

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

int co_create(stCoRoutine_t **ppco,stCoRoutineAttr_t *attr,pfn_co_routine_t pfn,void *arg)

{
  stCoRoutineEnv_t *psVar1;
  stCoRoutine_t *psVar2;
  stCoRoutine_t *co;
  void *arg_local;
  pfn_co_routine_t pfn_local;
  stCoRoutineAttr_t *attr_local;
  stCoRoutine_t **ppco_local;
  
  psVar1 = co_get_curr_thread_env();
  if (psVar1 == (stCoRoutineEnv_t *)0x0) {
    co_init_curr_thread_env();
  }
  psVar1 = co_get_curr_thread_env();
  psVar2 = co_create_env(psVar1,attr,pfn,arg);
  *ppco = psVar2;
  return 0;
}

Assistant:

int co_create( stCoRoutine_t **ppco,const stCoRoutineAttr_t *attr,pfn_co_routine_t pfn,void *arg )
{
	if( !co_get_curr_thread_env() ) 
	{
		co_init_curr_thread_env();
	}
	stCoRoutine_t *co = co_create_env( co_get_curr_thread_env(), attr, pfn,arg );
	*ppco = co;
	return 0;
}